

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizationCreator.hpp
# Opt level: O0

void __thiscall
OpenMD::OptimizationBuilder<QuantLib::SteepestDescent>::~OptimizationBuilder
          (OptimizationBuilder<QuantLib::SteepestDescent> *this)

{
  void *in_RDI;
  
  ~OptimizationBuilder((OptimizationBuilder<QuantLib::SteepestDescent> *)0x242618);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

OptimizationBuilder(const std::string& ident) :
        OptimizationCreator(ident) {}